

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

void strip_oprops(obj *otmp)

{
  uint uVar1;
  uint uVar2;
  
  if (otmp->oprops != 0) {
    if ((uwep == otmp) || (uswapwep == otmp)) {
      set_artifact_intrinsic(otmp,'\0',(long)otmp->owornmask,'\x01');
    }
    else {
      uVar1 = 0x40;
      if (uarmu != otmp) {
        uVar1 = (uint)(uarm == otmp);
      }
      uVar2 = 2;
      if (uarmc != otmp) {
        uVar2 = uVar1;
      }
      uVar1 = 4;
      if (uarmh != otmp) {
        uVar1 = uVar2;
      }
      uVar2 = 8;
      if (uarms != otmp) {
        uVar2 = uVar1;
      }
      uVar1 = 0x10;
      if (uarmg != otmp) {
        uVar1 = uVar2;
      }
      uVar2 = 0x20;
      if (uarmf != otmp) {
        uVar2 = uVar1;
      }
      uVar1 = 0x10000;
      if (uamul != otmp) {
        uVar1 = uVar2;
      }
      uVar2 = 0x20000;
      if (uleft != otmp) {
        uVar2 = uVar1;
      }
      uVar1 = 0x40000;
      if (uright != otmp) {
        uVar1 = uVar2;
      }
      if (uVar1 != 0) {
        Oprops_off(otmp,uVar1);
      }
    }
    otmp->oprops = 0;
    otmp->oprops_known = 0;
  }
  return;
}

Assistant:

static void strip_oprops(struct obj *otmp)
{
	if (!otmp || !otmp->oprops)
	    return;

	if (otmp == uwep || otmp == uswapwep) {
	    set_artifact_intrinsic(otmp, FALSE, otmp->owornmask, TRUE);
	} else {
	    unsigned int which = 0;
	    if (otmp == uarm) which = W_ARM;
	    if (otmp == uarmu) which = W_ARMU;
	    if (otmp == uarmc) which = W_ARMC;
	    if (otmp == uarmh) which = W_ARMH;
	    if (otmp == uarms) which = W_ARMS;
	    if (otmp == uarmg) which = W_ARMG;
	    if (otmp == uarmf) which = W_ARMF;
	    if (otmp == uamul) which = W_AMUL;
	    if (otmp == uleft) which = W_RINGL;
	    if (otmp == uright) which = W_RINGR;
	    if (which != 0) Oprops_off(otmp, which);
	}

	otmp->oprops = otmp->oprops_known = 0L;
}